

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  char *pcVar6;
  uint local_cac;
  string code;
  Script script;
  string local_c68;
  char cmd [256];
  State state;
  Memory memory;
  
  LiteScript::Memory::Memory(&memory);
  LiteScript::State::State(&state,&memory);
  LiteScript::Script::Script(&script,&state);
  LiteScript::CreateVariable((LiteScript *)cmd,&memory,print_var);
  LiteScript::DeclareVariable(&state,"print",(Variable *)cmd);
  LiteScript::Variable::~Variable((Variable *)cmd);
  if (1 < argc) {
    readfile_abi_cxx11_((string *)cmd,argv[1],(uint *)&code);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)cmd
                            ,"error : can\'t open the file");
    if (bVar2) {
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)cmd);
      poVar5 = std::operator<<(poVar5," \"");
      poVar5 = std::operator<<(poVar5,argv[1]);
      poVar5 = std::operator<<(poVar5,"\"");
      std::endl<char,std::char_traits<char>>(poVar5);
      iVar3 = -1;
    }
    else {
      LiteScript::Script::Execute(&script,(char *)CONCAT44(cmd._4_4_,cmd._0_4_));
      if (script.error == SCRPT_ERROR_NO) {
        iVar3 = 0;
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"ERROR(");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        poVar5 = std::operator<<(poVar5,",");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        poVar5 = std::operator<<(poVar5,"): ");
        pcVar6 = LiteScript::Script::GetError(&script);
        poVar5 = std::operator<<(poVar5,pcVar6);
        std::endl<char,std::char_traits<char>>(poVar5);
        iVar3 = 1;
      }
    }
    std::__cxx11::string::~string((string *)cmd);
LAB_0012009e:
    LiteScript::State::~State(&state);
    LiteScript::Memory::~Memory(&memory);
    return iVar3;
  }
  code._M_dataplus._M_p = (pointer)&code.field_2;
  code._M_string_length = 0;
  code.field_2._M_local_buf[0] = '\0';
  poVar5 = std::operator<<((ostream *)&std::cout,"Enter script code :");
  std::endl<char,std::char_traits<char>>(poVar5);
  display_commands(4,command_help._M_elems);
  do {
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    code._M_string_length = 0;
    *code._M_dataplus._M_p = '\0';
    uVar4 = 1;
    while( true ) {
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar5," > ");
      std::istream::getline((char *)&std::cin,(long)cmd);
      iVar3 = bcmp(cmd,"file ",5);
      uVar1 = cmd._0_4_;
      if (iVar3 == 0) break;
      if (cmd._0_4_ == 0x706c6568) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Commands :");
        std::endl<char,std::char_traits<char>>(poVar5);
        display_commands(4,command_help._M_elems);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
      else {
        iVar3 = bcmp(cmd,"exit",5);
        if (iVar3 == 0) {
          std::__cxx11::string::~string((string *)&code);
          iVar3 = 0;
          goto LAB_0012009e;
        }
        if ((char)uVar1 == '\0') goto LAB_0011ff5a;
        std::__cxx11::string::append((char *)&code);
        std::__cxx11::string::push_back((char)&code);
        uVar4 = uVar4 + 1;
      }
    }
    local_cac = uVar4;
    readfile_abi_cxx11_(&local_c68,cmd + 5,&local_cac);
    std::__cxx11::string::append((string *)&code);
    std::__cxx11::string::~string((string *)&local_c68);
    uVar4 = local_cac;
LAB_0011ff5a:
    local_cac = uVar4;
    std::__cxx11::string::pop_back();
    LiteScript::Script::Execute(&script,code._M_dataplus._M_p);
    if (script.error != SCRPT_ERROR_NO) {
      poVar5 = std::operator<<((ostream *)&std::cout,"ERROR(");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,",");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,"): ");
      pcVar6 = LiteScript::Script::GetError(&script);
      poVar5 = std::operator<<(poVar5,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  } while( true );
}

Assistant:

int main(int argc, char * argv[]) {
    // We create the main memory and the script state
    Memory memory;
    State state(memory);
    // We create an assembly object
    Script script(state);

    // We add the "print" callback in the global namespace
    DeclareVariable(state, "print", CreateVariable(memory, print_var));

    // If there is a parameter, it's a file assembly script to execute
    if (argc > 1) {
        unsigned int i;
        // We read the file content
        std::string code = readfile(argv[1], i);
        if (code == "error : can't open the file") {
            std::cout << code << " \"" << argv[1] << "\"" << std::endl;
            return -1;
        }

        // We execute the script
        script.Execute(code.c_str());
        // If there is an error, we print it
        if (script.error != Script::ErrorType::SCRPT_ERROR_NO) {
            std::cout << "ERROR(" << (script.line_error + 1) << "," << (script.col_error + 1) << "): " << script.GetError() << std::endl;
            return 1;
        }
        return 0;
    }

    // Else we read lines on the keyboard
    // (the script execution is relatively the same as above)
    char cmd[256];
    std::string code;
    unsigned int line_num;
    std::cout << "Enter script code :" << std::endl;
    display_commands(command_help.size(), command_help.data());
    while (true) {
        line_num = 1;
        std::cout << std::endl;
        code.clear();
        while (true) {
            std::cout << line_num << " > ";
            std::cin.getline(cmd, 256);
            if (strncmp(cmd, "file ", 5) == 0) {
                code += readfile(cmd + 5, line_num);
                break;
            }
            else if (strncmp(cmd, "help", 4) == 0) {
                std::cout << "Commands :" << std::endl;
                display_commands(command_help.size(), command_help.data());
                std::cout << std::endl;
                continue;
            }
            else if (strcmp(cmd, "exit") == 0)
                return 0;
            else if (cmd[0] == '\0')
                break;
            code += cmd;
            code += '\n';
            line_num++;
        }
        code.pop_back();

        script.Execute(code.c_str());
        if (script.error != Script::ErrorType::SCRPT_ERROR_NO)
            std::cout << "ERROR(" << (script.line_error + 1) << "," << (script.col_error + 1) << "): " << script.GetError() << std::endl;
    }
}